

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O2

DdNode * Cudd_addTimesPlus(DdManager *dd,DdNode *A,DdNode *B,DdNode **z,int nz)

{
  DdNode *n;
  DdNode *pDVar1;
  ulong uVar2;
  DdNode *n_00;
  
  n = Cudd_addApply(dd,Cudd_addTimes,A,B);
  if (n != (DdNode *)0x0) {
    Cudd_Ref(n);
    n_00 = dd->one;
    Cudd_Ref(n_00);
    for (uVar2 = (ulong)(uint)nz; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      pDVar1 = Cudd_addIte(dd,z[uVar2 - 1],n_00,dd->zero);
      if (pDVar1 == (DdNode *)0x0) goto LAB_0061faae;
      Cudd_Ref(pDVar1);
      Cudd_RecursiveDeref(dd,n_00);
      n_00 = pDVar1;
    }
    pDVar1 = Cudd_addExistAbstract(dd,n,n_00);
    if (pDVar1 != (DdNode *)0x0) {
      Cudd_Ref(pDVar1);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,n);
      Cudd_Deref(pDVar1);
      return pDVar1;
    }
    Cudd_RecursiveDeref(dd,n);
    n = n_00;
LAB_0061faae:
    Cudd_RecursiveDeref(dd,n);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addTimesPlus(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  DdNode ** z,
  int  nz)
{
    DdNode *w, *cube, *tmp, *res; 
    int i;
    tmp = Cudd_addApply(dd,Cudd_addTimes,A,B);
    if (tmp == NULL) return(NULL);
    Cudd_Ref(tmp);
    Cudd_Ref(cube = DD_ONE(dd));
    for (i = nz-1; i >= 0; i--) {
         w = Cudd_addIte(dd,z[i],cube,DD_ZERO(dd));
         if (w == NULL) {
            Cudd_RecursiveDeref(dd,tmp);
            return(NULL);
         }
         Cudd_Ref(w);
         Cudd_RecursiveDeref(dd,cube);
         cube = w;
    }
    res = Cudd_addExistAbstract(dd,tmp,cube);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,tmp);
        Cudd_RecursiveDeref(dd,cube);
        return(NULL);
    }
    Cudd_Ref(res);
    Cudd_RecursiveDeref(dd,cube);
    Cudd_RecursiveDeref(dd,tmp);
    Cudd_Deref(res);
    return(res);

}